

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

int32_t icu_63::offsetStrToMillis(UnicodeString *str,UErrorCode *status)

{
  short sVar1;
  char16_t cVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint uVar6;
  int local_38;
  
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  sVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar6 = (str->fUnion).fFields.fLength;
  }
  else {
    uVar6 = (int)sVar1 >> 5;
  }
  if ((uVar6 & 0xfffffffd) == 5) {
    iVar5 = 0;
    cVar2 = UnicodeString::doCharAt(str,0);
    if (cVar2 == L'+') {
      local_38 = 1000;
    }
    else {
      if (cVar2 != L'-') goto LAB_0021dfac;
      local_38 = -1000;
    }
    iVar3 = parseAsciiDigits(str,1,2,status);
    iVar4 = parseAsciiDigits(str,3,2,status);
    if (uVar6 == 7) {
      iVar5 = parseAsciiDigits(str,5,2,status);
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      return local_38 * (iVar5 + (iVar3 * 0x3c + iVar4) * 0x3c);
    }
  }
LAB_0021dfac:
  *status = U_INVALID_FORMAT_ERROR;
  return 0;
}

Assistant:

static int32_t offsetStrToMillis(const UnicodeString& str, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return 0;
    }

    UBool isValid = FALSE;
    int32_t sign = 0, hour = 0, min = 0, sec = 0;

    do {
        int length = str.length();
        if (length != 5 && length != 7) {
            // utf-offset must be 5 or 7 characters
            break;
        }
        // sign
        UChar s = str.charAt(0);
        if (s == PLUS) {
            sign = 1;
        } else if (s == MINUS) {
            sign = -1;
        } else {
            // utf-offset must start with "+" or "-"
            break;
        }
        hour = parseAsciiDigits(str, 1, 2, status);
        min = parseAsciiDigits(str, 3, 2, status);
        if (length == 7) {
            sec = parseAsciiDigits(str, 5, 2, status);
        }
        if (U_FAILURE(status)) {
            break;
        }
        isValid = true;
    } while(false);

    if (!isValid) {
        status = U_INVALID_FORMAT_ERROR;
        return 0;
    }
    int32_t millis = sign * ((hour * 60 + min) * 60 + sec) * 1000;
    return millis;
}